

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

expr * printreg(disctx *ctx,ull *a,ull *m,reg *reg)

{
  int iVar1;
  sreg *psVar2;
  int iVar3;
  ull uVar4;
  expr *peVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  expr *unaff_R15;
  bool bVar9;
  
  if (reg->bf == (bitfield *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = getbf(reg->bf,a,m,ctx);
  }
  psVar2 = reg->specials;
  if (psVar2 != (sreg *)0x0) {
    iVar3 = psVar2->num;
    bVar9 = iVar3 == -1;
    if (!bVar9) {
      unaff_R15 = (expr *)0x0;
      do {
        if (((psVar2->vartype == 0) || ((ctx->vartype & psVar2->vartype) != 0)) &&
           (uVar4 == (long)iVar3)) {
          switch(psVar2->mode) {
          case SR_NAMED:
            unaff_R15 = (expr *)calloc(0x48,1);
            unaff_R15->type = EXPR_REG;
            unaff_R15->str = psVar2->name;
            unaff_R15->special = 1;
          case SR_ZERO:
            goto switchD_0016e9d3_caseD_1;
          case SR_ONE:
            unaff_R15 = (expr *)calloc(0x48,1);
            unaff_R15->type = EXPR_NUM;
            unaff_R15->num1 = 1;
            goto switchD_0016e9d3_caseD_1;
          case SR_DISCARD:
            unaff_R15 = (expr *)calloc(0x48,1);
            unaff_R15->type = EXPR_DISCARD;
            goto switchD_0016e9d3_caseD_1;
          }
        }
        iVar3 = psVar2[1].num;
        bVar9 = iVar3 == -1;
        psVar2 = psVar2 + 1;
      } while (!bVar9);
    }
switchD_0016e9d3_caseD_1:
    if (!bVar9) {
      return unaff_R15;
    }
  }
  peVar5 = (expr *)calloc(0x48,1);
  peVar5->type = EXPR_REG;
  pcVar7 = "";
  if (reg->suffix != (char *)0x0) {
    pcVar7 = reg->suffix;
  }
  pcVar6 = "h";
  if ((uVar4 & 1) == 0) {
    pcVar6 = "l";
  }
  iVar3 = reg->hilo;
  if (iVar3 == 0) {
    pcVar6 = pcVar7;
  }
  iVar1 = reg->cool;
  peVar5->special = iVar1;
  iVar8 = 2;
  if (reg->always_special == 0) {
    iVar8 = iVar1;
  }
  peVar5->special = iVar8;
  if (reg->bf == (bitfield *)0x0) {
    pcVar7 = aprint("%s%s",reg->name,pcVar6);
  }
  else {
    pcVar7 = aprint("%s%lld%s",reg->name,uVar4 >> (iVar3 != 0),pcVar6);
  }
  peVar5->str = pcVar7;
  return peVar5;
}

Assistant:

static struct expr *printreg (struct disctx *ctx, ull *a, ull *m, const struct reg *reg) {
	struct expr *expr;
	ull num = 0;
	if (reg->bf)
		num = GETBF(reg->bf);
	if (reg->specials) {
		int i;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (reg->specials[i].vartype && !(reg->specials[i].vartype & ctx->vartype))
				continue;
			if (num == reg->specials[i].num) {
				switch (reg->specials[i].mode) {
					case SR_NAMED:
						expr = makeex(EXPR_REG);
						expr->str = reg->specials[i].name;
						expr->special = 1;
						return expr;
					case SR_ZERO:
						return 0;
					case SR_ONE:
						expr = makeex(EXPR_NUM);
						expr->num1 = 1;
						return expr;
					case SR_DISCARD:
						expr = makeex(EXPR_DISCARD);
						return expr;
				}
			}
		}
	}
	expr = makeex(EXPR_REG);
	const char *suf = "";
	if (reg->suffix)
		suf = reg->suffix;
	if (reg->hilo) {
		if (num & 1)
			suf = "h";
		else
			suf = "l";
		num >>= 1;
	}
	expr->special = reg->cool;
	if (reg->always_special)
		expr->special = 2;
	if (reg->bf)
		expr->str = aprint("%s%lld%s", reg->name, num, suf);
	else
		expr->str = aprint("%s%s", reg->name, suf);
	return expr;
}